

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

ComplexTypeInfo * __thiscall
xercesc_4_0::TraverseSchema::getElementComplexTypeInfo
          (TraverseSchema *this,DOMElement *elem,XMLCh *typeStr,XMLCh *otherSchemaURI)

{
  XMLBuffer *pXVar1;
  SchemaInfo **enclosingSchema;
  short *psVar2;
  XMLCh XVar3;
  XMLStringPool *pXVar4;
  ValueVectorOf<int> *pVVar5;
  _func_int **pp_Var6;
  SchemaInfo *pSVar7;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar8;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar14;
  Grammar *pGVar15;
  ulong uVar16;
  SchemaInfo *toRestore;
  DOMElement *elem_00;
  undefined4 extraout_var_01;
  XMLSize_t XVar17;
  ulong uVar18;
  XMLCh *pXVar19;
  XMLCh XVar20;
  ulong uVar21;
  ListType aListType;
  XMLSize_t getAt;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *pRVar22;
  ComplexTypeInfo *pCVar23;
  XMLCh *pXVar24;
  undefined8 *puVar25;
  bool bVar26;
  XMLBuffer buffCopy;
  XMLCh *local_80;
  XMLBuffer local_70;
  SchemaInfo *local_38;
  
  iVar11 = XMLString::indexOf(typeStr,L':');
  XVar17 = 0;
  if (typeStr != (XMLCh *)0x0) {
    do {
      psVar2 = (short *)((long)typeStr + XVar17);
      XVar17 = XVar17 + 2;
    } while (*psVar2 != 0);
    XVar17 = ((long)XVar17 >> 1) - 1;
  }
  pXVar24 = L"";
  local_80 = L"";
  if (XVar17 != (long)(iVar11 + 1)) {
    pXVar1 = &this->fBuffer;
    if (iVar11 == -1) {
      pXVar1->fIndex = 0;
      pXVar14 = typeStr;
    }
    else {
      XVar17 = XVar17 + ~(long)iVar11;
      pXVar1->fIndex = 0;
      pXVar14 = typeStr + (long)iVar11 + 1;
    }
    XMLBuffer::append(pXVar1,pXVar14,XVar17);
    pXVar4 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar12 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4);
    iVar11 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar12);
    local_80 = (XMLCh *)CONCAT44(extraout_var,iVar11);
  }
  iVar11 = XMLString::indexOf(typeStr,L':');
  if (1 < iVar11 + 1U) {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,typeStr,(long)iVar11);
    pXVar4 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar12 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4);
    iVar11 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar12);
    pXVar24 = (XMLCh *)CONCAT44(extraout_var_00,iVar11);
  }
  pXVar14 = otherSchemaURI;
  if (otherSchemaURI == (XMLCh *)0x0) {
    pXVar14 = resolvePrefixToURI(this,elem,pXVar24);
  }
  local_38 = this->fSchemaInfo;
  uVar12 = this->fCurrentScope;
  pXVar1 = &this->fBuffer;
  (this->fBuffer).fIndex = 0;
  if ((pXVar14 != (XMLCh *)0x0) && (*pXVar14 != L'\0')) {
    XMLBuffer::append(pXVar1,pXVar14);
  }
  if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(pXVar1,1);
  }
  enclosingSchema = &this->fSchemaInfo;
  XVar17 = (this->fBuffer).fIndex;
  (this->fBuffer).fIndex = XVar17 + 1;
  (this->fBuffer).fBuffer[XVar17] = L',';
  XMLBuffer::append(pXVar1,local_80);
  if (otherSchemaURI == (XMLCh *)0x0) {
    pRVar9 = this->fComplexTypeRegistry;
    pXVar24 = (this->fBuffer).fBuffer;
    pXVar24[(this->fBuffer).fIndex] = L'\0';
    if ((pXVar24 == (XMLCh *)0x0) || (uVar16 = (ulong)(ushort)*pXVar24, uVar16 == 0)) {
      uVar16 = 0;
    }
    else {
      XVar20 = pXVar24[1];
      if (XVar20 != L'\0') {
        pXVar19 = pXVar24 + 2;
        do {
          uVar16 = (ulong)(ushort)XVar20 + (uVar16 >> 0x18) + uVar16 * 0x26;
          XVar20 = *pXVar19;
          pXVar19 = pXVar19 + 1;
        } while (XVar20 != L'\0');
      }
      uVar16 = uVar16 % pRVar9->fHashModulus;
    }
    pRVar22 = pRVar9->fBucketList[uVar16];
    if (pRVar22 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      do {
        bVar26 = StringHasher::equals((StringHasher *)&pRVar9->field_0x30,pXVar24,pRVar22->fKey);
        if (bVar26) goto LAB_003380f6;
        pRVar22 = pRVar22->fNext;
      } while (pRVar22 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
    }
    pRVar22 = (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0;
LAB_003380f6:
    aListType = INCLUDE;
    if (pRVar22 == (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      pCVar23 = (ComplexTypeInfo *)0x0;
    }
    else {
      pCVar23 = pRVar22->fData;
    }
  }
  else {
    iVar11 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
    pVVar5 = this->fImportedNSList;
    if (pVVar5 == (ValueVectorOf<int> *)0x0) {
LAB_003381de:
      aListType = INCLUDE;
      bVar26 = false;
LAB_003381e0:
      pCVar23 = (ComplexTypeInfo *)0x0;
    }
    else {
      uVar16 = pVVar5->fCurCount;
      bVar26 = uVar16 != 0;
      if (uVar16 == 0) {
LAB_0033800e:
        if (!bVar26) goto LAB_003381de;
      }
      else if (*pVVar5->fElemList != iVar11) {
        uVar18 = 0;
        do {
          uVar21 = uVar16;
          if (uVar16 - 1 == uVar18) break;
          uVar21 = uVar18 + 1;
          lVar10 = uVar18 + 1;
          uVar18 = uVar21;
        } while (pVVar5->fElemList[lVar10] != iVar11);
        bVar26 = uVar21 < uVar16;
        goto LAB_0033800e;
      }
      pGVar15 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar14);
      if ((pGVar15 == (Grammar *)0x0) ||
         (iVar13 = (*(pGVar15->super_XSerializable)._vptr_XSerializable[5])(pGVar15), iVar13 != 1))
      {
        bVar26 = false;
        pCVar23 = (ComplexTypeInfo *)0x0;
        aListType = INCLUDE;
      }
      else {
        pp_Var6 = pGVar15[7].super_XSerializable._vptr_XSerializable;
        pXVar24 = (this->fBuffer).fBuffer;
        pXVar24[(this->fBuffer).fIndex] = L'\0';
        if ((pXVar24 == (XMLCh *)0x0) || (uVar16 = (ulong)(ushort)*pXVar24, uVar16 == 0)) {
          uVar16 = 0;
        }
        else {
          XVar20 = pXVar24[1];
          if (XVar20 != L'\0') {
            pXVar19 = pXVar24 + 2;
            do {
              uVar16 = (ulong)(ushort)XVar20 + (uVar16 >> 0x18) + uVar16 * 0x26;
              XVar20 = *pXVar19;
              pXVar19 = pXVar19 + 1;
            } while (XVar20 != L'\0');
          }
          uVar16 = uVar16 % (ulong)pp_Var6[3];
        }
        puVar25 = *(undefined8 **)(pp_Var6[2] + uVar16 * 8);
        if (puVar25 == (undefined8 *)0x0) {
          puVar25 = (undefined8 *)0x0;
        }
        else {
          do {
            bVar26 = StringHasher::equals((StringHasher *)(pp_Var6 + 6),pXVar24,(void *)puVar25[2]);
            if (bVar26) goto LAB_0033815b;
            puVar25 = (undefined8 *)puVar25[1];
          } while (puVar25 != (undefined8 *)0x0);
          puVar25 = (undefined8 *)0x0;
        }
LAB_0033815b:
        aListType = INCLUDE;
        if (puVar25 == (undefined8 *)0x0) {
          pCVar23 = (ComplexTypeInfo *)0x0;
        }
        else {
          pCVar23 = (ComplexTypeInfo *)*puVar25;
        }
        if (pCVar23 == (ComplexTypeInfo *)0x0) {
          pSVar7 = *enclosingSchema;
          pRVar8 = pSVar7->fImportedInfoList;
          if (pRVar8 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
            XVar17 = 0;
          }
          else {
            XVar17 = (pRVar8->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
          }
          if (XVar17 != 0) {
            getAt = 0;
            do {
              toRestore = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                    (&pSVar7->fImportedInfoList->
                                      super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
              if (toRestore->fTargetNSURI == iVar11) goto LAB_003381cf;
              getAt = getAt + 1;
            } while (XVar17 != getAt);
          }
          toRestore = (SchemaInfo *)0x0;
LAB_003381cf:
          if ((toRestore == (SchemaInfo *)0x0) || (toRestore->fProcessed != false))
          goto LAB_003381de;
          restoreSchemaInfo(this,toRestore,IMPORT,0xfffffffe);
          aListType = IMPORT;
          bVar26 = true;
          goto LAB_003381e0;
        }
        bVar26 = false;
      }
    }
    if (!bVar26) {
      return pCVar23;
    }
  }
  if (pCVar23 != (ComplexTypeInfo *)0x0) goto LAB_003383e7;
  if (pXVar14 == L"http://www.w3.org/2001/XMLSchema") {
LAB_0033822a:
    pXVar24 = this->fTargetNSURIString;
    if (pXVar24 != L"http://www.w3.org/2001/XMLSchema") {
      pXVar14 = L"http://www.w3.org/2001/XMLSchema";
      if (pXVar24 != (XMLCh *)0x0) {
        pCVar23 = (ComplexTypeInfo *)0x0;
        do {
          XVar20 = *pXVar24;
          if (XVar20 == L'\0') goto LAB_00338263;
          pXVar24 = pXVar24 + 1;
          XVar3 = *pXVar14;
          pXVar14 = pXVar14 + 1;
        } while (XVar20 == XVar3);
        goto LAB_003383e7;
      }
LAB_00338263:
      if (*pXVar14 != L'\0') {
        pCVar23 = (ComplexTypeInfo *)0x0;
        goto LAB_003383e7;
      }
    }
  }
  else {
    pXVar24 = L"http://www.w3.org/2001/XMLSchema";
    if (pXVar14 == (XMLCh *)0x0) {
LAB_00338224:
      if (*pXVar24 == L'\0') goto LAB_0033822a;
    }
    else {
      do {
        XVar20 = *pXVar14;
        if (XVar20 == L'\0') goto LAB_00338224;
        pXVar14 = pXVar14 + 1;
        XVar3 = *pXVar24;
        pXVar24 = pXVar24 + 1;
      } while (XVar20 == XVar3);
    }
  }
  pCVar23 = (ComplexTypeInfo *)0x0;
  elem_00 = SchemaInfo::getTopLevelComponent
                      (*enclosingSchema,0,L"complexType",local_80,enclosingSchema);
  if (elem_00 != (DOMElement *)0x0) {
    XVar17 = (this->fBuffer).fIndex;
    local_70.fMemoryManager = this->fMemoryManager;
    local_70.fCapacity = XVar17 + 1;
    local_70.fIndex = 0;
    local_70.fFullSize = 0;
    local_70.fUsed = false;
    local_70.fFullHandler = (XMLBufferFullHandler *)0x0;
    local_70.fBuffer = (XMLCh *)0x0;
    iVar11 = (*(local_70.fMemoryManager)->_vptr_MemoryManager[3])
                       (local_70.fMemoryManager,XVar17 * 2 + 4);
    local_70.fBuffer = (XMLCh *)CONCAT44(extraout_var_01,iVar11);
    *local_70.fBuffer = L'\0';
    pXVar24 = (this->fBuffer).fBuffer;
    pXVar24[(this->fBuffer).fIndex] = L'\0';
    local_70.fIndex = 0;
    if ((pXVar24 != (XMLCh *)0x0) && (*pXVar24 != L'\0')) {
      XMLBuffer::append(&local_70,pXVar24);
    }
    traverseComplexTypeDecl(this,elem_00,true,(XMLCh *)0x0);
    pXVar24 = local_70.fBuffer;
    pRVar9 = this->fComplexTypeRegistry;
    local_70.fBuffer[local_70.fIndex] = L'\0';
    if ((local_70.fBuffer == (XMLCh *)0x0) ||
       (uVar16 = (ulong)(ushort)*local_70.fBuffer, uVar16 == 0)) {
      uVar16 = 0;
    }
    else {
      XVar20 = local_70.fBuffer[1];
      if (XVar20 != L'\0') {
        pXVar14 = local_70.fBuffer + 2;
        do {
          uVar16 = (ulong)(ushort)XVar20 + (uVar16 >> 0x18) + uVar16 * 0x26;
          XVar20 = *pXVar14;
          pXVar14 = pXVar14 + 1;
        } while (XVar20 != L'\0');
      }
      uVar16 = uVar16 % pRVar9->fHashModulus;
    }
    pRVar22 = pRVar9->fBucketList[uVar16];
    if (pRVar22 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      do {
        bVar26 = StringHasher::equals((StringHasher *)&pRVar9->field_0x30,pXVar24,pRVar22->fKey);
        if (bVar26) goto LAB_003383c1;
        pRVar22 = pRVar22->fNext;
      } while (pRVar22 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
    }
    pRVar22 = (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0;
LAB_003383c1:
    if (pRVar22 == (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      pCVar23 = (ComplexTypeInfo *)0x0;
    }
    else {
      pCVar23 = pRVar22->fData;
    }
    (*(local_70.fMemoryManager)->_vptr_MemoryManager[4])(local_70.fMemoryManager,local_70.fBuffer);
  }
LAB_003383e7:
  restoreSchemaInfo(this,local_38,aListType,uVar12);
  return pCVar23;
}

Assistant:

ComplexTypeInfo*
TraverseSchema::getElementComplexTypeInfo(const DOMElement* const elem,
                                          const XMLCh* const typeStr,
                                          const XMLCh* const otherSchemaURI)
{
    const XMLCh*         localPart = getLocalPart(typeStr);
    const XMLCh*         prefix = getPrefix(typeStr);
    const XMLCh*         typeURI = (otherSchemaURI) ? otherSchemaURI : resolvePrefixToURI(elem, prefix);
    ComplexTypeInfo*     typeInfo = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    fBuffer.set(typeURI);
    fBuffer.append(chComma);
    fBuffer.append(localPart);

    if (otherSchemaURI != 0) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(typeURI);

        if (!isImportingNS(uriId))
            return 0;

        Grammar* aGrammar = fGrammarResolver->getGrammar(typeURI);

        if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {
            return 0;
        }

        typeInfo = ((SchemaGrammar*)aGrammar)->getComplexTypeRegistry()->get(fBuffer.getRawBuffer());

        if (typeInfo) {
            return typeInfo;
        }

        SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

        if (!impInfo || impInfo->getProcessed()) {
            return 0;
        }

        infoType = SchemaInfo::IMPORT;
        restoreSchemaInfo(impInfo, infoType);
    }
    else {
        typeInfo = fComplexTypeRegistry->get(fBuffer.getRawBuffer());
    }

    if (!typeInfo) {
        if (!XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA) ||
            XMLString::equals(fTargetNSURIString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            DOMElement* typeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_ComplexType,
                SchemaSymbols::fgELT_COMPLEXTYPE, localPart, &fSchemaInfo);

            if (typeNode) {
                // fBuffer is reused by traverseComplexTypeDecl, so we have to store its current value
                XMLBuffer buffCopy(fBuffer.getLen()+1, fMemoryManager);
                buffCopy.set(fBuffer.getRawBuffer());
                traverseComplexTypeDecl(typeNode);
                typeInfo =  fComplexTypeRegistry->get(buffCopy.getRawBuffer());
            }
        }
    }

    // restore schema information
    restoreSchemaInfo(saveInfo, infoType, saveScope);
    return typeInfo;
}